

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O0

lzma_vli index_file_size(lzma_vli compressed_base,lzma_vli unpadded_sum,lzma_vli record_count,
                        lzma_vli index_list_size,lzma_vli stream_padding)

{
  lzma_vli lVar1;
  ulong uVar2;
  lzma_vli file_size;
  lzma_vli stream_padding_local;
  lzma_vli index_list_size_local;
  lzma_vli record_count_local;
  lzma_vli unpadded_sum_local;
  lzma_vli compressed_base_local;
  
  lVar1 = vli_ceil4(unpadded_sum);
  uVar2 = compressed_base + 0x18 + stream_padding + lVar1;
  if (uVar2 < 0x8000000000000000) {
    lVar1 = index_size(record_count,index_list_size);
    compressed_base_local = lVar1 + uVar2;
    if (0x7fffffffffffffff < compressed_base_local) {
      compressed_base_local = 0xffffffffffffffff;
    }
  }
  else {
    compressed_base_local = 0xffffffffffffffff;
  }
  return compressed_base_local;
}

Assistant:

static lzma_vli
index_file_size(lzma_vli compressed_base, lzma_vli unpadded_sum,
		lzma_vli record_count, lzma_vli index_list_size,
		lzma_vli stream_padding)
{
	// Earlier Streams and Stream Paddings + Stream Header
	// + Blocks + Index + Stream Footer + Stream Padding
	//
	// This might go over LZMA_VLI_MAX due to too big unpadded_sum
	// when this function is used in lzma_index_append().
	lzma_vli file_size = compressed_base + 2 * LZMA_STREAM_HEADER_SIZE
			+ stream_padding + vli_ceil4(unpadded_sum);
	if (file_size > LZMA_VLI_MAX)
		return LZMA_VLI_UNKNOWN;

	// The same applies here.
	file_size += index_size(record_count, index_list_size);
	if (file_size > LZMA_VLI_MAX)
		return LZMA_VLI_UNKNOWN;

	return file_size;
}